

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taylor.hpp
# Opt level: O3

taylor<double,_2,_12> *
operator*(taylor<double,_2,_12> *__return_storage_ptr__,int *x,taylor<double,_2,_12> *t)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  taylor<double,_2,_12> *ptVar4;
  int i;
  int i_00;
  
  i_00 = 0;
  memset(__return_storage_ptr__,0,0x2d8);
  do {
    iVar2 = *x;
    pdVar3 = taylor<double,_2,_12>::operator[](t,i_00);
    dVar1 = *pdVar3;
    ptVar4 = (taylor<double,_2,_12> *)taylor<double,_2,_12>::operator[](__return_storage_ptr__,i_00)
    ;
    (ptVar4->super_polynomial<double,_2,_12>).c[0] = (double)iVar2 * dVar1;
    i_00 = i_00 + 1;
  } while (i_00 != 0x5b);
  return ptVar4;
}

Assistant:

static taylor<T, Nvar, Ndeg> operator*(const S & x,
                                       const taylor<T, Nvar, Ndeg> & t) {
  taylor<T, Nvar, Ndeg> tmp;
  for (int i = 0; i < tmp.size; i++)
    tmp[i] = x * t[i];
  return tmp;
}